

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_study.c
# Opt level: O2

int set_start_bits(pcre2_real_code_8 *re,PCRE2_SPTR8 code,BOOL utf)

{
  PCRE2_SPTR8 pPVar1;
  byte bVar2;
  ushort uVar3;
  uint table_limit;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  int iVar7;
  long lVar8;
  byte bVar9;
  BOOL caseless;
  uint32_t *puVar10;
  int iVar11;
  uint32_t cvalue;
  byte *pbVar12;
  ulong uVar13;
  ulong uStack_60;
  byte local_56 [6];
  uint8_t *puStack_50;
  PCRE2_UCHAR8 buff [6];
  PCRE2_SPTR8 local_40;
  
  table_limit = (uint)(utf == 0) * 0x10 + 0x10;
  bVar9 = *code;
  puStack_50 = re->start_bitmap + 0x19;
  iVar7 = 1;
  local_40 = code;
LAB_0012cce8:
  pbVar12 = local_40 + 3;
  if ((bVar9 - 0x86 < 7) && ((99U >> (bVar9 - 0x86 & 0x1f) & 1) != 0)) {
    pbVar12 = local_40 + 5;
  }
LAB_0012cd0d:
  uStack_60 = 1;
  iVar11 = iVar7;
switchD_0012cd45_caseD_78:
  iVar7 = iVar11;
  if ((int)uStack_60 == 0) {
    uVar3 = *(ushort *)(local_40 + 1) << 8 | *(ushort *)(local_40 + 1) >> 8;
    pPVar1 = local_40 + uVar3;
    local_40 = local_40 + uVar3;
    bVar9 = 0x78;
    if (*pPVar1 != 'x') {
      return iVar7;
    }
    goto LAB_0012cce8;
  }
  bVar9 = *pbVar12;
  uStack_60 = 0;
  uVar13 = 0;
  iVar11 = 2;
  switch(bVar9) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x12:
  case 0x14:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1f:
  case 0x20:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x7d:
  case 0x88:
  case 0x8d:
  case 0x8e:
  case 0x8f:
  case 0x90:
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x97:
  case 0x98:
  case 0x99:
  case 0x9a:
  case 0x9b:
  case 0x9c:
  case 0x9d:
  case 0x9e:
  case 0x9f:
  case 0xa0:
  case 0xa1:
  case 0xa2:
    goto switchD_0012cd45_caseD_0;
  case 4:
  case 5:
  case 0x57:
  case 0x58:
  case 0x5f:
    goto switchD_0012cd45_caseD_4;
  case 6:
    iVar11 = 0x40;
    goto LAB_0012cfa9;
  case 7:
    iVar11 = 0x40;
    goto LAB_0012cf6d;
  case 8:
    iVar11 = 0;
    goto LAB_0012cfa9;
  case 9:
    iVar11 = 0;
    goto LAB_0012cf6d;
  case 10:
    iVar11 = 0xa0;
LAB_0012cfa9:
    uStack_60 = 0;
    set_nottype_bits(re,iVar11,table_limit);
    iVar11 = iVar7;
    goto switchD_0012cd45_caseD_78;
  case 0xb:
    iVar11 = 0xa0;
LAB_0012cf6d:
    uStack_60 = 0;
    set_type_bits(re,iVar11,table_limit);
    iVar11 = iVar7;
    goto switchD_0012cd45_caseD_78;
  case 0x10:
    if (pbVar12[1] == 9) {
      puVar10 = _pcre2_ucd_caseless_sets_8 + pbVar12[2];
      while (cvalue = *puVar10, cvalue != 0xffffffff) {
        puVar10 = puVar10 + 1;
        if (utf == 0) {
          if (cvalue < 0x100) goto LAB_0012cf44;
          re->start_bitmap[0x1f] = re->start_bitmap[0x1f] | 0x80;
        }
        else {
          _pcre2_ord2utf_8(cvalue,local_56);
          cvalue = (uint32_t)local_56[0];
LAB_0012cf44:
          re->start_bitmap[cvalue >> 3] =
               re->start_bitmap[cvalue >> 3] | (byte)(1 << ((byte)cvalue & 7));
        }
      }
      uStack_60 = 0;
      iVar11 = iVar7;
      goto switchD_0012cd45_caseD_78;
    }
switchD_0012cd45_caseD_0:
    iVar5 = 0;
    break;
  case 0x11:
  case 0x15:
    re->start_bitmap[1] = re->start_bitmap[1] | 0x3c;
    if (utf == 0) {
      re->start_bitmap[0x10] = re->start_bitmap[0x10] | 0x20;
      uStack_60 = uVar13;
      iVar11 = iVar7;
    }
    else {
      re->start_bitmap[0x18] = re->start_bitmap[0x18] | 4;
      re->start_bitmap[0x1c] = re->start_bitmap[0x1c] | 4;
      uStack_60 = uVar13;
      iVar11 = iVar7;
    }
    goto switchD_0012cd45_caseD_78;
  case 0x13:
    re->start_bitmap[1] = re->start_bitmap[1] | 2;
    re->start_bitmap[4] = re->start_bitmap[4] | 1;
    if (utf == 0) {
      re->start_bitmap[0x14] = re->start_bitmap[0x14] | 1;
      uStack_60 = uVar13;
      iVar11 = iVar7;
    }
    else {
      re->start_bitmap[0x18] = re->start_bitmap[0x18] | 4;
      re->start_bitmap[0x1c] = re->start_bitmap[0x1c] | 0xe;
      uStack_60 = uVar13;
      iVar11 = iVar7;
    }
    goto switchD_0012cd45_caseD_78;
  case 0x1d:
  case 0x23:
  case 0x24:
  case 0x2b:
    goto switchD_0012cd45_caseD_1d;
  case 0x1e:
  case 0x30:
  case 0x31:
  case 0x38:
    goto switchD_0012cd45_caseD_1e;
  case 0x21:
  case 0x22:
  case 0x25:
  case 0x26:
  case 0x2a:
  case 0x2c:
    pbVar12 = pbVar12 + 1;
    goto LAB_0012d0e5;
  case 0x27:
  case 0x28:
  case 0x2d:
    pbVar12 = pbVar12 + 3;
LAB_0012d0e5:
    pbVar12 = set_table_bit(re,pbVar12,0,utf);
    goto LAB_0012cd0d;
  case 0x29:
    pbVar12 = pbVar12 + 2;
switchD_0012cd45_caseD_1d:
    caseless = 0;
LAB_0012cfc7:
    set_table_bit(re,pbVar12 + 1,caseless,utf);
    uStack_60 = 0;
    iVar11 = iVar7;
    goto switchD_0012cd45_caseD_78;
  case 0x2e:
  case 0x2f:
  case 0x32:
  case 0x33:
  case 0x37:
  case 0x39:
    pbVar12 = pbVar12 + 1;
    goto LAB_0012cd6b;
  case 0x34:
  case 0x35:
  case 0x3a:
    pbVar12 = pbVar12 + 3;
LAB_0012cd6b:
    uStack_60 = 1;
    pbVar12 = set_table_bit(re,pbVar12,1,utf);
    iVar11 = iVar7;
    goto switchD_0012cd45_caseD_78;
  case 0x36:
    pbVar12 = pbVar12 + 2;
switchD_0012cd45_caseD_1e:
    caseless = 1;
    goto LAB_0012cfc7;
  case 0x55:
  case 0x56:
  case 0x59:
  case 0x5a:
  case 0x5e:
  case 0x60:
    goto switchD_0012cd45_caseD_55;
  case 0x5b:
  case 0x5c:
  case 0x61:
    pbVar12 = pbVar12 + 2;
switchD_0012cd45_caseD_55:
    iVar5 = 0;
    switch(pbVar12[1]) {
    case 6:
      iVar11 = 0x40;
      break;
    case 7:
      iVar11 = 0x40;
      goto LAB_0012d178;
    case 8:
      iVar11 = 0;
      break;
    case 9:
      iVar11 = 0;
      goto LAB_0012d178;
    case 10:
      iVar11 = 0xa0;
      break;
    case 0xb:
      iVar11 = 0xa0;
LAB_0012d178:
      set_type_bits(re,iVar11,table_limit);
      goto LAB_0012d199;
    default:
      goto switchD_0012d0c3_caseD_c;
    case 0x11:
    case 0x15:
      re->start_bitmap[1] = re->start_bitmap[1] | 0x3c;
      if (utf == 0) {
        re->start_bitmap[0x10] = re->start_bitmap[0x10] | 0x20;
      }
      else {
        re->start_bitmap[0x18] = re->start_bitmap[0x18] | 4;
        re->start_bitmap[0x1c] = re->start_bitmap[0x1c] | 4;
      }
      goto LAB_0012d199;
    case 0x13:
      re->start_bitmap[1] = re->start_bitmap[1] | 2;
      re->start_bitmap[4] = re->start_bitmap[4] | 1;
      if (utf == 0) {
        re->start_bitmap[0x14] = re->start_bitmap[0x14] | 1;
      }
      else {
        re->start_bitmap[0x18] = re->start_bitmap[0x18] | 4;
        re->start_bitmap[0x1c] = re->start_bitmap[0x1c] | 0xe;
      }
      goto LAB_0012d199;
    }
    set_nottype_bits(re,iVar11,table_limit);
LAB_0012d199:
    pbVar12 = pbVar12 + 2;
    goto LAB_0012cd0d;
  case 0x5d:
    goto switchD_0012cd45_caseD_5d;
  default:
    iVar5 = 3;
    break;
  case 0x6e:
    goto switchD_0012cd45_caseD_6e;
  case 0x6f:
    pbVar6 = (byte *)0x0;
    goto LAB_0012cdd5;
  case 0x70:
    bVar2 = pbVar12[3];
    if ((bVar2 & 4) != 0) {
      return 0;
    }
    if ((bVar2 & 3) == 1) {
      return 0;
    }
    pbVar6 = (byte *)0x0;
    if ((bVar2 & 2) != 0) {
      pbVar6 = pbVar12 + 4;
    }
LAB_0012cdd5:
    if (utf != 0) {
      re->start_bitmap[0x18] = re->start_bitmap[0x18] | 0xf0;
      puStack_50[3] = 0xff;
      puStack_50[4] = 0xff;
      puStack_50[5] = 0xff;
      puStack_50[6] = 0xff;
      puStack_50[0] = 0xff;
      puStack_50[1] = 0xff;
      puStack_50[2] = 0xff;
      puStack_50[3] = 0xff;
      bVar9 = *pbVar12;
    }
    if (bVar9 == 0x70) {
      pbVar12 = pbVar12 + (ushort)(*(ushort *)(pbVar12 + 1) << 8 | *(ushort *)(pbVar12 + 1) >> 8);
      if (pbVar6 != (byte *)0x0) goto LAB_0012ce10;
    }
    else {
switchD_0012cd45_caseD_6e:
      pbVar6 = pbVar12 + 1;
      pbVar12 = pbVar12 + 0x21;
LAB_0012ce10:
      lVar8 = 0;
      if (utf == 0) {
        for (; lVar8 != 0x20; lVar8 = lVar8 + 1) {
          re->start_bitmap[lVar8] = re->start_bitmap[lVar8] | pbVar6[lVar8];
        }
      }
      else {
        for (; lVar8 != 0x10; lVar8 = lVar8 + 1) {
          re->start_bitmap[lVar8] = re->start_bitmap[lVar8] | pbVar6[lVar8];
        }
        for (uVar4 = 0x80; uVar4 < 0x100; uVar4 = uVar4 + 1) {
          if (pbVar6[uVar4 >> 3] != 0) {
            re->start_bitmap[0x18] =
                 re->start_bitmap[0x18] | (byte)(1 << ((byte)(uVar4 >> 6) & 0x1f));
            uVar4 = uVar4 | 0x3f;
          }
        }
      }
    }
    uVar4 = *pbVar12 - 0x62;
    iVar11 = iVar7;
    if (uVar4 < 0xc) {
      if ((0x533U >> (uVar4 & 0x1f) & 1) != 0) goto switchD_0012cd45_caseD_4;
      uStack_60 = uVar13;
      if ((0x8c0U >> (uVar4 & 0x1f) & 1) != 0) {
        uStack_60 = (ulong)((*(ushort *)(pbVar12 + 1) & 0xff) == 0 &&
                           *(ushort *)(pbVar12 + 1) >> 8 == 0);
        pbVar12 = pbVar12 + uStack_60 * 5;
      }
    }
    goto switchD_0012cd45_caseD_78;
  case 0x76:
    uVar13 = 6;
    goto LAB_0012d115;
  case 0x77:
    uVar13 = (ulong)(ushort)(*(ushort *)(pbVar12 + 5) << 8 | *(ushort *)(pbVar12 + 5) >> 8);
LAB_0012d115:
    pbVar12 = pbVar12 + uVar13;
    goto LAB_0012cd0d;
  case 0x78:
    goto switchD_0012cd45_caseD_78;
  case 0x79:
  case 0x7a:
  case 0x7b:
  case 0x7c:
    iVar5 = 2;
    break;
  case 0x7e:
  case 0x82:
  case 0x83:
  case 0x84:
  case 0x85:
  case 0x86:
  case 0x87:
  case 0x89:
  case 0x8a:
  case 0x8b:
  case 0x8c:
    iVar5 = set_start_bits(re,pbVar12,utf);
    iVar11 = iVar7;
    if (iVar5 == 1) goto switchD_0012cd45_caseD_78;
    if ((iVar5 != 0) && (iVar5 != 3)) goto LAB_0012d041;
    break;
  case 0x7f:
  case 0x80:
  case 0x81:
    goto switchD_0012cd45_caseD_7f;
  case 0x94:
  case 0x95:
  case 0x96:
    pbVar12 = pbVar12 + 1;
    iVar5 = set_start_bits(re,pbVar12,utf);
    if ((iVar5 != 0) && (iVar5 != 3)) goto LAB_0012d080;
    break;
  case 0xa3:
    pbVar12 = pbVar12 + 1;
    do {
      uVar3 = *(ushort *)(pbVar12 + 1) << 8 | *(ushort *)(pbVar12 + 1) >> 8;
      pbVar6 = pbVar12 + uVar3;
      pbVar12 = pbVar12 + uVar3;
    } while (*pbVar6 == 0x78);
    goto switchD_0012cd45_caseD_5d;
  }
switchD_0012d0c3_caseD_c:
  return iVar5;
LAB_0012d080:
  do {
    uVar3 = *(ushort *)(pbVar12 + 1) << 8 | *(ushort *)(pbVar12 + 1) >> 8;
    pbVar6 = pbVar12 + uVar3;
    pbVar12 = pbVar12 + uVar3;
  } while (*pbVar6 == 0x78);
switchD_0012cd45_caseD_5d:
  pbVar12 = pbVar12 + 3;
  goto LAB_0012cd0d;
switchD_0012cd45_caseD_7f:
  do {
    uVar3 = *(ushort *)(pbVar12 + 1) << 8 | *(ushort *)(pbVar12 + 1) >> 8;
    pbVar6 = pbVar12 + uVar3;
    pbVar12 = pbVar12 + uVar3;
  } while (*pbVar6 == 0x78);
  goto switchD_0012cd45_caseD_5d;
LAB_0012d041:
  do {
    uVar3 = *(ushort *)(pbVar12 + 1) << 8 | *(ushort *)(pbVar12 + 1) >> 8;
    pbVar6 = pbVar12 + uVar3;
    pbVar12 = pbVar12 + uVar3;
  } while (*pbVar6 == 0x78);
  goto switchD_0012cd45_caseD_5d;
switchD_0012cd45_caseD_4:
  pbVar12 = pbVar12 + 1;
  goto LAB_0012cd0d;
}

Assistant:

static int
set_start_bits(pcre2_real_code *re, PCRE2_SPTR code, BOOL utf)
{
register uint32_t c;
int yield = SSB_DONE;

#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8
int table_limit = utf? 16:32;
#else
int table_limit = 32;
#endif

do
  {
  BOOL try_next = TRUE;
  PCRE2_SPTR tcode = code + 1 + LINK_SIZE;

  if (*code == OP_CBRA || *code == OP_SCBRA ||
      *code == OP_CBRAPOS || *code == OP_SCBRAPOS) tcode += IMM2_SIZE;

  while (try_next)    /* Loop for items in this branch */
    {
    int rc;
    uint8_t *classmap = NULL;

    switch(*tcode)
      {
      /* If we reach something we don't understand, it means a new opcode has
      been created that hasn't been added to this function. Hopefully this
      problem will be discovered during testing. */

      default:
      return SSB_UNKNOWN;

      /* Fail for a valid opcode that implies no starting bits. */

      case OP_ACCEPT:
      case OP_ASSERT_ACCEPT:
      case OP_ALLANY:
      case OP_ANY:
      case OP_ANYBYTE:
      case OP_CIRC:
      case OP_CIRCM:
      case OP_CLOSE:
      case OP_COMMIT:
      case OP_COND:
      case OP_CREF:
      case OP_FALSE:
      case OP_TRUE:
      case OP_DNCREF:
      case OP_DNREF:
      case OP_DNREFI:
      case OP_DNRREF:
      case OP_DOLL:
      case OP_DOLLM:
      case OP_END:
      case OP_EOD:
      case OP_EODN:
      case OP_EXTUNI:
      case OP_FAIL:
      case OP_MARK:
      case OP_NOT:
      case OP_NOTEXACT:
      case OP_NOTEXACTI:
      case OP_NOTI:
      case OP_NOTMINPLUS:
      case OP_NOTMINPLUSI:
      case OP_NOTMINQUERY:
      case OP_NOTMINQUERYI:
      case OP_NOTMINSTAR:
      case OP_NOTMINSTARI:
      case OP_NOTMINUPTO:
      case OP_NOTMINUPTOI:
      case OP_NOTPLUS:
      case OP_NOTPLUSI:
      case OP_NOTPOSPLUS:
      case OP_NOTPOSPLUSI:
      case OP_NOTPOSQUERY:
      case OP_NOTPOSQUERYI:
      case OP_NOTPOSSTAR:
      case OP_NOTPOSSTARI:
      case OP_NOTPOSUPTO:
      case OP_NOTPOSUPTOI:
      case OP_NOTPROP:
      case OP_NOTQUERY:
      case OP_NOTQUERYI:
      case OP_NOTSTAR:
      case OP_NOTSTARI:
      case OP_NOTUPTO:
      case OP_NOTUPTOI:
      case OP_NOT_HSPACE:
      case OP_NOT_VSPACE:
      case OP_PRUNE:
      case OP_PRUNE_ARG:
      case OP_RECURSE:
      case OP_REF:
      case OP_REFI:
      case OP_REVERSE:
      case OP_RREF:
      case OP_SCOND:
      case OP_SET_SOM:
      case OP_SKIP:
      case OP_SKIP_ARG:
      case OP_SOD:
      case OP_SOM:
      case OP_THEN:
      case OP_THEN_ARG:
      return SSB_FAIL;

      /* A "real" property test implies no starting bits, but the fake property
      PT_CLIST identifies a list of characters. These lists are short, as they
      are used for characters with more than one "other case", so there is no
      point in recognizing them for OP_NOTPROP. */

      case OP_PROP:
      if (tcode[1] != PT_CLIST) return SSB_FAIL;
        {
        const uint32_t *p = PRIV(ucd_caseless_sets) + tcode[2];
        while ((c = *p++) < NOTACHAR)
          {
#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8
          if (utf)
            {
            PCRE2_UCHAR buff[6];
            (void)PRIV(ord2utf)(c, buff);
            c = buff[0];
            }
#endif
          if (c > 0xff) SET_BIT(0xff); else SET_BIT(c);
          }
        }
      try_next = FALSE;
      break;

      /* We can ignore word boundary tests. */

      case OP_WORD_BOUNDARY:
      case OP_NOT_WORD_BOUNDARY:
      tcode++;
      break;

      /* If we hit a bracket or a positive lookahead assertion, recurse to set
      bits from within the subpattern. If it can't find anything, we have to
      give up. If it finds some mandatory character(s), we are done for this
      branch. Otherwise, carry on scanning after the subpattern. */

      case OP_BRA:
      case OP_SBRA:
      case OP_CBRA:
      case OP_SCBRA:
      case OP_BRAPOS:
      case OP_SBRAPOS:
      case OP_CBRAPOS:
      case OP_SCBRAPOS:
      case OP_ONCE:
      case OP_ONCE_NC:
      case OP_ASSERT:
      rc = set_start_bits(re, tcode, utf);
      if (rc == SSB_FAIL || rc == SSB_UNKNOWN) return rc;
      if (rc == SSB_DONE) try_next = FALSE; else
        {
        do tcode += GET(tcode, 1); while (*tcode == OP_ALT);
        tcode += 1 + LINK_SIZE;
        }
      break;

      /* If we hit ALT or KET, it means we haven't found anything mandatory in
      this branch, though we might have found something optional. For ALT, we
      continue with the next alternative, but we have to arrange that the final
      result from subpattern is SSB_CONTINUE rather than SSB_DONE. For KET,
      return SSB_CONTINUE: if this is the top level, that indicates failure,
      but after a nested subpattern, it causes scanning to continue. */

      case OP_ALT:
      yield = SSB_CONTINUE;
      try_next = FALSE;
      break;

      case OP_KET:
      case OP_KETRMAX:
      case OP_KETRMIN:
      case OP_KETRPOS:
      return SSB_CONTINUE;

      /* Skip over callout */

      case OP_CALLOUT:
      tcode += PRIV(OP_lengths)[OP_CALLOUT];
      break;

      case OP_CALLOUT_STR:
      tcode += GET(tcode, 1 + 2*LINK_SIZE);
      break;

      /* Skip over lookbehind and negative lookahead assertions */

      case OP_ASSERT_NOT:
      case OP_ASSERTBACK:
      case OP_ASSERTBACK_NOT:
      do tcode += GET(tcode, 1); while (*tcode == OP_ALT);
      tcode += 1 + LINK_SIZE;
      break;

      /* BRAZERO does the bracket, but carries on. */

      case OP_BRAZERO:
      case OP_BRAMINZERO:
      case OP_BRAPOSZERO:
      rc = set_start_bits(re, ++tcode, utf);
      if (rc == SSB_FAIL || rc == SSB_UNKNOWN) return rc;
      do tcode += GET(tcode,1); while (*tcode == OP_ALT);
      tcode += 1 + LINK_SIZE;
      break;

      /* SKIPZERO skips the bracket. */

      case OP_SKIPZERO:
      tcode++;
      do tcode += GET(tcode,1); while (*tcode == OP_ALT);
      tcode += 1 + LINK_SIZE;
      break;

      /* Single-char * or ? sets the bit and tries the next item */

      case OP_STAR:
      case OP_MINSTAR:
      case OP_POSSTAR:
      case OP_QUERY:
      case OP_MINQUERY:
      case OP_POSQUERY:
      tcode = set_table_bit(re, tcode + 1, FALSE, utf);
      break;

      case OP_STARI:
      case OP_MINSTARI:
      case OP_POSSTARI:
      case OP_QUERYI:
      case OP_MINQUERYI:
      case OP_POSQUERYI:
      tcode = set_table_bit(re, tcode + 1, TRUE, utf);
      break;

      /* Single-char upto sets the bit and tries the next */

      case OP_UPTO:
      case OP_MINUPTO:
      case OP_POSUPTO:
      tcode = set_table_bit(re, tcode + 1 + IMM2_SIZE, FALSE, utf);
      break;

      case OP_UPTOI:
      case OP_MINUPTOI:
      case OP_POSUPTOI:
      tcode = set_table_bit(re, tcode + 1 + IMM2_SIZE, TRUE, utf);
      break;

      /* At least one single char sets the bit and stops */

      case OP_EXACT:
      tcode += IMM2_SIZE;
      /* Fall through */
      case OP_CHAR:
      case OP_PLUS:
      case OP_MINPLUS:
      case OP_POSPLUS:
      (void)set_table_bit(re, tcode + 1, FALSE, utf);
      try_next = FALSE;
      break;

      case OP_EXACTI:
      tcode += IMM2_SIZE;
      /* Fall through */
      case OP_CHARI:
      case OP_PLUSI:
      case OP_MINPLUSI:
      case OP_POSPLUSI:
      (void)set_table_bit(re, tcode + 1, TRUE, utf);
      try_next = FALSE;
      break;

      /* Special spacing and line-terminating items. These recognize specific
      lists of characters. The difference between VSPACE and ANYNL is that the
      latter can match the two-character CRLF sequence, but that is not
      relevant for finding the first character, so their code here is
      identical. */

      case OP_HSPACE:
      SET_BIT(CHAR_HT);
      SET_BIT(CHAR_SPACE);

      /* For the 16-bit and 32-bit libraries (which can never be EBCDIC), set
      the bits for 0xA0 and for code units >= 255, independently of UTF. */

#if PCRE2_CODE_UNIT_WIDTH != 8
      SET_BIT(0xA0);
      SET_BIT(0xFF);
#else
      /* For the 8-bit library in UTF-8 mode, set the bits for the first code
      units of horizontal space characters. */

#ifdef SUPPORT_UNICODE
      if (utf)
        {
        SET_BIT(0xC2);  /* For U+00A0 */
        SET_BIT(0xE1);  /* For U+1680, U+180E */
        SET_BIT(0xE2);  /* For U+2000 - U+200A, U+202F, U+205F */
        SET_BIT(0xE3);  /* For U+3000 */
        }
      else
#endif
      /* For the 8-bit library not in UTF-8 mode, set the bit for 0xA0, unless
      the code is EBCDIC. */
        {
#ifndef EBCDIC
        SET_BIT(0xA0);
#endif  /* Not EBCDIC */
        }
#endif  /* 8-bit support */

      try_next = FALSE;
      break;

      case OP_ANYNL:
      case OP_VSPACE:
      SET_BIT(CHAR_LF);
      SET_BIT(CHAR_VT);
      SET_BIT(CHAR_FF);
      SET_BIT(CHAR_CR);

      /* For the 16-bit and 32-bit libraries (which can never be EBCDIC), set
      the bits for NEL and for code units >= 255, independently of UTF. */

#if PCRE2_CODE_UNIT_WIDTH != 8
      SET_BIT(CHAR_NEL);
      SET_BIT(0xFF);
#else
      /* For the 8-bit library in UTF-8 mode, set the bits for the first code
      units of vertical space characters. */

#ifdef SUPPORT_UNICODE
      if (utf)
        {
        SET_BIT(0xC2);  /* For U+0085 (NEL) */
        SET_BIT(0xE2);  /* For U+2028, U+2029 */
        }
      else
#endif
      /* For the 8-bit library not in UTF-8 mode, set the bit for NEL. */
        {
        SET_BIT(CHAR_NEL);
        }
#endif  /* 8-bit support */

      try_next = FALSE;
      break;

      /* Single character types set the bits and stop. Note that if PCRE2_UCP
      is set, we do not see these op codes because \d etc are converted to
      properties. Therefore, these apply in the case when only characters less
      than 256 are recognized to match the types. */

      case OP_NOT_DIGIT:
      set_nottype_bits(re, cbit_digit, table_limit);
      try_next = FALSE;
      break;

      case OP_DIGIT:
      set_type_bits(re, cbit_digit, table_limit);
      try_next = FALSE;
      break;

      case OP_NOT_WHITESPACE:
      set_nottype_bits(re, cbit_space, table_limit);
      try_next = FALSE;
      break;

      case OP_WHITESPACE:
      set_type_bits(re, cbit_space, table_limit);
      try_next = FALSE;
      break;

      case OP_NOT_WORDCHAR:
      set_nottype_bits(re, cbit_word, table_limit);
      try_next = FALSE;
      break;

      case OP_WORDCHAR:
      set_type_bits(re, cbit_word, table_limit);
      try_next = FALSE;
      break;

      /* One or more character type fudges the pointer and restarts, knowing
      it will hit a single character type and stop there. */

      case OP_TYPEPLUS:
      case OP_TYPEMINPLUS:
      case OP_TYPEPOSPLUS:
      tcode++;
      break;

      case OP_TYPEEXACT:
      tcode += 1 + IMM2_SIZE;
      break;

      /* Zero or more repeats of character types set the bits and then
      try again. */

      case OP_TYPEUPTO:
      case OP_TYPEMINUPTO:
      case OP_TYPEPOSUPTO:
      tcode += IMM2_SIZE;  /* Fall through */

      case OP_TYPESTAR:
      case OP_TYPEMINSTAR:
      case OP_TYPEPOSSTAR:
      case OP_TYPEQUERY:
      case OP_TYPEMINQUERY:
      case OP_TYPEPOSQUERY:
      switch(tcode[1])
        {
        default:
        case OP_ANY:
        case OP_ALLANY:
        return SSB_FAIL;

        case OP_HSPACE:
        SET_BIT(CHAR_HT);
        SET_BIT(CHAR_SPACE);

        /* For the 16-bit and 32-bit libraries (which can never be EBCDIC), set
        the bits for 0xA0 and for code units >= 255, independently of UTF. */

#if PCRE2_CODE_UNIT_WIDTH != 8
        SET_BIT(0xA0);
        SET_BIT(0xFF);
#else
        /* For the 8-bit library in UTF-8 mode, set the bits for the first code
        units of horizontal space characters. */

#ifdef SUPPORT_UNICODE
        if (utf)
          {
          SET_BIT(0xC2);  /* For U+00A0 */
          SET_BIT(0xE1);  /* For U+1680, U+180E */
          SET_BIT(0xE2);  /* For U+2000 - U+200A, U+202F, U+205F */
          SET_BIT(0xE3);  /* For U+3000 */
          }
        else
#endif
        /* For the 8-bit library not in UTF-8 mode, set the bit for 0xA0, unless
        the code is EBCDIC. */
          {
#ifndef EBCDIC
          SET_BIT(0xA0);
#endif  /* Not EBCDIC */
          }
#endif  /* 8-bit support */
        break;

        case OP_ANYNL:
        case OP_VSPACE:
        SET_BIT(CHAR_LF);
        SET_BIT(CHAR_VT);
        SET_BIT(CHAR_FF);
        SET_BIT(CHAR_CR);

        /* For the 16-bit and 32-bit libraries (which can never be EBCDIC), set
        the bits for NEL and for code units >= 255, independently of UTF. */

#if PCRE2_CODE_UNIT_WIDTH != 8
        SET_BIT(CHAR_NEL);
        SET_BIT(0xFF);
#else
        /* For the 8-bit library in UTF-8 mode, set the bits for the first code
        units of vertical space characters. */

#ifdef SUPPORT_UNICODE
        if (utf)
          {
          SET_BIT(0xC2);  /* For U+0085 (NEL) */
          SET_BIT(0xE2);  /* For U+2028, U+2029 */
          }
        else
#endif
        /* For the 8-bit library not in UTF-8 mode, set the bit for NEL. */
          {
          SET_BIT(CHAR_NEL);
          }
#endif  /* 8-bit support */
        break;

        case OP_NOT_DIGIT:
        set_nottype_bits(re, cbit_digit, table_limit);
        break;

        case OP_DIGIT:
        set_type_bits(re, cbit_digit, table_limit);
        break;

        case OP_NOT_WHITESPACE:
        set_nottype_bits(re, cbit_space, table_limit);
        break;

        case OP_WHITESPACE:
        set_type_bits(re, cbit_space, table_limit);
        break;

        case OP_NOT_WORDCHAR:
        set_nottype_bits(re, cbit_word, table_limit);
        break;

        case OP_WORDCHAR:
        set_type_bits(re, cbit_word, table_limit);
        break;
        }

      tcode += 2;
      break;

      /* Extended class: if there are any property checks, or if this is a
      negative XCLASS without a map, give up. If there are no property checks,
      there must be wide characters on the XCLASS list, because otherwise an
      XCLASS would not have been created. This means that code points >= 255
      are always potential starters. */

#ifdef SUPPORT_WIDE_CHARS
      case OP_XCLASS:
      if ((tcode[1 + LINK_SIZE] & XCL_HASPROP) != 0 ||
          (tcode[1 + LINK_SIZE] & (XCL_MAP|XCL_NOT)) == XCL_NOT)
        return SSB_FAIL;

      /* We have a positive XCLASS or a negative one without a map. Set up the
      map pointer if there is one, and fall through. */

      classmap = ((tcode[1 + LINK_SIZE] & XCL_MAP) == 0)? NULL :
        (uint8_t *)(tcode + 1 + LINK_SIZE + 1);
#endif

      /* Enter here for a negative non-XCLASS. In the 8-bit library, if we are
      in UTF mode, any byte with a value >= 0xc4 is a potentially valid starter
      because it starts a character with a value > 255. In 8-bit non-UTF mode,
      there is no difference between CLASS and NCLASS. In all other wide
      character modes, set the 0xFF bit to indicate code units >= 255. */

      case OP_NCLASS:
#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8
      if (utf)
        {
        re->start_bitmap[24] |= 0xf0;            /* Bits for 0xc4 - 0xc8 */
        memset(re->start_bitmap+25, 0xff, 7);    /* Bits for 0xc9 - 0xff */
        }
#elif PCRE2_CODE_UNIT_WIDTH != 8
      SET_BIT(0xFF);                             /* For characters >= 255 */
#endif
      /* Fall through */

      /* Enter here for a positive non-XCLASS. If we have fallen through from
      an XCLASS, classmap will already be set; just advance the code pointer.
      Otherwise, set up classmap for a a non-XCLASS and advance past it. */

      case OP_CLASS:
      if (*tcode == OP_XCLASS) tcode += GET(tcode, 1); else
        {
        classmap = (uint8_t *)(++tcode);
        tcode += 32 / sizeof(PCRE2_UCHAR);
        }

      /* When wide characters are supported, classmap may be NULL. In UTF-8
      (sic) mode, the bits in a class bit map correspond to character values,
      not to byte values. However, the bit map we are constructing is for byte
      values. So we have to do a conversion for characters whose code point is
      greater than 127. In fact, there are only two possible starting bytes for
      characters in the range 128 - 255. */

      if (classmap != NULL)
        {
#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8
        if (utf)
          {
          for (c = 0; c < 16; c++) re->start_bitmap[c] |= classmap[c];
          for (c = 128; c < 256; c++)
            {
            if ((classmap[c/8] && (1 << (c&7))) != 0)
              {
              int d = (c >> 6) | 0xc0;            /* Set bit for this starter */
              re->start_bitmap[d/8] |= (1 << (d&7));  /* and then skip on to the */
              c = (c & 0xc0) + 0x40 - 1;          /* next relevant character. */
              }
            }
          }
        else
#endif
        /* In all modes except UTF-8, the two bit maps are compatible. */

          {
          for (c = 0; c < 32; c++) re->start_bitmap[c] |= classmap[c];
          }
        }

      /* Act on what follows the class. For a zero minimum repeat, continue;
      otherwise stop processing. */

      switch (*tcode)
        {
        case OP_CRSTAR:
        case OP_CRMINSTAR:
        case OP_CRQUERY:
        case OP_CRMINQUERY:
        case OP_CRPOSSTAR:
        case OP_CRPOSQUERY:
        tcode++;
        break;

        case OP_CRRANGE:
        case OP_CRMINRANGE:
        case OP_CRPOSRANGE:
        if (GET2(tcode, 1) == 0) tcode += 1 + 2 * IMM2_SIZE;
          else try_next = FALSE;
        break;

        default:
        try_next = FALSE;
        break;
        }
      break; /* End of class handling case */
      }      /* End of switch for opcodes */
    }        /* End of try_next loop */

  code += GET(code, 1);   /* Advance to next branch */
  }
while (*code == OP_ALT);

return yield;
}